

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::Reg1(ByteCodeWriter *this,OpCode op,RegSlot R0)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  OpLayoutType local_1c;
  RegSlot RStack_18;
  bool success;
  OpCode local_12;
  RegSlot R0_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  RStack_18 = R0;
  local_12 = op;
  _R0_local = this;
  CheckOpen(this);
  op_00 = local_12;
  OpLayoutType::OpLayoutType(&local_1c,Reg1);
  CheckOp(this,op_00,local_1c);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(local_12);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x16a,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  RStack_18 = ConsumeReg(this,RStack_18);
  bVar2 = TryWriteReg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,local_12,RStack_18);
  if (((!bVar2) &&
      (bVar2 = TryWriteReg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,local_12,RStack_18),
      !bVar2)) &&
     (bVar2 = TryWriteReg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>(this,local_12,RStack_18), !bVar2
     )) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x16e,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::Reg1(OpCode op, RegSlot R0)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);

        MULTISIZE_LAYOUT_WRITE(Reg1, op, R0);
    }